

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromisehelpers.h
# Opt level: O0

Type __thiscall
QtPromise::resolve<std::vector<int,std::allocator<int>>>
          (QtPromise *this,vector<int,_std::allocator<int>_> *value)

{
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<std::vector<int,_std::allocator<int>_>_>_>
  extraout_RDX;
  Type TVar1;
  anon_class_8_1_a8c68091 local_20;
  vector<int,_std::allocator<int>_> *local_18;
  vector<int,_std::allocator<int>_> *value_local;
  
  local_20.value = value;
  local_18 = value;
  value_local = (vector<int,_std::allocator<int>_> *)this;
  QPromise<std::vector<int,std::allocator<int>>>::
  QPromise<QtPromise::resolve<std::vector<int,std::allocator<int>>>(std::vector<int,std::allocator<int>>&&)::_lambda(QtPromise::QPromiseResolve<std::vector<int,std::allocator<int>>>&&,QtPromise::QPromiseReject<std::vector<int,std::allocator<int>>>&&)_1_>
            ((QPromise<std::vector<int,std::allocator<int>>> *)this,&local_20);
  TVar1.super_QPromiseBase<std::vector<int,_std::allocator<int>_>_>.m_d.d = extraout_RDX.d;
  TVar1.super_QPromiseBase<std::vector<int,_std::allocator<int>_>_>._vptr_QPromiseBase =
       (_func_int **)this;
  return (Type)TVar1.super_QPromiseBase<std::vector<int,_std::allocator<int>_>_>;
}

Assistant:

static inline typename QtPromisePrivate::PromiseDeduce<T>::Type resolve(T&& value)
{
    using namespace QtPromisePrivate;
    using PromiseType = typename PromiseDeduce<T>::Type;
    using ValueType = typename PromiseType::Type;
    using ResolveType = QPromiseResolve<ValueType>;
    using RejectType = QPromiseReject<ValueType>;

    return PromiseType{[&](ResolveType&& resolve, RejectType&& reject) {
        PromiseFulfill<Unqualified<T>>::call(std::forward<T>(value),
                                             std::forward<ResolveType>(resolve),
                                             std::forward<RejectType>(reject));
    }};
}